

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RC4.cc
# Opt level: O3

void __thiscall
Pl_RC4::Pl_RC4(Pl_RC4 *this,char *identifier,Pipeline *next,uchar *key_data,int key_len,
              size_t out_bufsize)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  logic_error *this_01;
  uchar *indata;
  int iVar3;
  undefined4 in_register_00000084;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  indata = key_data;
  iVar3 = key_len;
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_RC4_002eb720;
  (this->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->out_bufsize = out_bufsize;
  RC4::RC4(&this->rc4,(RC4_KEY *)key_data,(ulong)(uint)key_len,indata,
           (uchar *)CONCAT44(in_register_00000084,iVar3));
  if (next != (Pipeline *)0x0) {
    peVar2 = (element_type *)operator_new__(out_bufsize);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<unsigned_char*,std::default_delete<unsigned_char[]>,std::allocator<void>,void>
              (&_Stack_30,peVar2);
    _Var1._M_pi = _Stack_30._M_pi;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (this->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var1._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
      }
    }
    return;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,"Attempt to create Pl_RC4 with nullptr as next");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Pl_RC4::Pl_RC4(
    char const* identifier,
    Pipeline* next,
    unsigned char const* key_data,
    int key_len,
    size_t out_bufsize) :
    Pipeline(identifier, next),
    out_bufsize(out_bufsize),
    rc4(key_data, key_len)
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_RC4 with nullptr as next");
    }
    this->outbuf = QUtil::make_shared_array<unsigned char>(out_bufsize);
}